

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void SlowSort(array *p,size_t Count,size_t Width,arraycmp Cmp,void *CmpParam,bool_t Unique)

{
  long lVar1;
  void *pvVar2;
  arraycmp p_Var3;
  bool_t bVar4;
  void *pvVar5;
  int iVar6;
  arraycmp p_Var7;
  char *pcVar8;
  undefined8 uStack_70;
  void *local_68;
  arraycmp local_60;
  char *j;
  char *i;
  char *End;
  unsigned_long __vla_expr0;
  bool_t local_38;
  bool_t Unique_local;
  void *CmpParam_local;
  arraycmp Cmp_local;
  size_t Width_local;
  size_t Count_local;
  array *p_local;
  
  __vla_expr0 = (unsigned_long)&local_68;
  lVar1 = -(Width + 0xf & 0xfffffffffffffff0);
  local_68 = (void *)((long)&local_68 + lVar1);
  End = (char *)Width;
  local_38 = Unique;
  Unique_local = (bool_t)CmpParam;
  CmpParam_local = Cmp;
  Cmp_local = (arraycmp)Width;
  Width_local = Count;
  Count_local = (size_t)p;
  if (p == (array *)0x0) {
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1355cf;
    __assert_fail("&(*p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                  ,0x161,"void SlowSort(array *, size_t, size_t, arraycmp, const void *, bool_t)");
  }
  i = p->_Begin + Count * Width;
  local_60 = (arraycmp)p->_Begin;
  j = (char *)local_60 + Width;
  __vla_expr0 = (unsigned_long)&local_68;
  do {
    pvVar2 = CmpParam_local;
    bVar4 = Unique_local;
    pcVar8 = j;
    p_Var3 = local_60;
    if (j == i) {
      if (local_38 != 0) {
        local_60 = *(arraycmp *)Count_local;
        for (j = (char *)(local_60 + (long)Cmp_local); pvVar2 = CmpParam_local, bVar4 = Unique_local
            , pcVar8 = j, p_Var3 = local_60, j != i; j = (char *)(Cmp_local + (long)j)) {
          *(undefined8 *)((long)&uStack_70 + lVar1) = 0x135702;
          iVar6 = (*(code *)pvVar2)(bVar4,pcVar8,p_Var3);
          p_Var3 = Cmp_local;
          pcVar8 = j;
          if (iVar6 != 0) {
            p_Var7 = Cmp_local + (long)local_60;
            local_60 = p_Var7;
            *(undefined8 *)((long)&uStack_70 + lVar1) = 0x135724;
            memcpy(p_Var7,pcVar8,(size_t)p_Var3);
          }
        }
        *(arraycmp *)(Count_local + 8) = Cmp_local + ((long)local_60 - *(long *)Count_local);
      }
      return;
    }
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x13561d;
    iVar6 = (*(code *)pvVar2)(bVar4,pcVar8,p_Var3);
    p_Var3 = Cmp_local;
    pcVar8 = j;
    pvVar2 = local_68;
    if (iVar6 < 0) {
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x135637;
      memcpy(pvVar2,pcVar8,(size_t)p_Var3);
      do {
        p_Var7 = Cmp_local;
        p_Var3 = local_60;
        pcVar8 = (char *)(local_60 + (long)Cmp_local);
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x13564c;
        memcpy(pcVar8,p_Var3,(size_t)p_Var7);
        pvVar5 = CmpParam_local;
        bVar4 = Unique_local;
        pvVar2 = local_68;
        if (local_60 == (arraycmp)*(char **)Count_local) {
          local_60 = local_60 + -(long)Cmp_local;
          break;
        }
        pcVar8 = (char *)(local_60 + -(long)Cmp_local);
        local_60 = (arraycmp)pcVar8;
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x135695;
        iVar6 = (*(code *)pvVar5)(bVar4,pvVar2,pcVar8);
      } while (iVar6 < 0);
      p_Var3 = Cmp_local;
      pvVar2 = local_68;
      pcVar8 = (char *)(local_60 + (long)Cmp_local);
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1356af;
      memcpy(pcVar8,pvVar2,(size_t)p_Var3);
    }
    local_60 = (arraycmp)j;
    j = (char *)(Cmp_local + (long)j);
  } while( true );
}

Assistant:

static void SlowSort(array* p, size_t Count, size_t Width, arraycmp Cmp, const void* CmpParam, bool_t Unique)
{
#if defined(_MSC_VER) && !defined (__clang__)
    uint8_t* Tmp = (uint8_t*)_alloca(Width);
#else
    uint8_t Tmp[Width];
#endif
    char* End = ARRAYBEGIN(*p,char) + Count*Width;
    char* i;
    char* j;

    j = p->_Begin;
    for (i=j+Width; i!=End; i+=Width)
    {
        if (Cmp(CmpParam,i,j) < 0)
        {
            memcpy(Tmp,i,Width);
            do
            {
                memcpy(j+Width,j,Width);
                if (j == p->_Begin)
                {
                    j -= Width;
                    break;
                }
                j -= Width;
            }
            while (Cmp(CmpParam,Tmp,j) < 0);
            memcpy(j+Width,Tmp,Width);
        }
        j = i;
    }

    if (Unique)
    {
        j = p->_Begin;
        for (i=j+Width; i!=End; i+=Width)
        {
            if (Cmp(CmpParam,i,j) != 0)
            {
                j += Width;
                memcpy(j,i,Width);
            }
        }
        p->_Used = j - p->_Begin + Width;
    }
}